

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  __node_base_ptr *this_00;
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  ulong uVar4;
  char (*in_R8) [2];
  string *in_R9;
  char (*in_stack_fffffffffffff688) [2];
  char (*in_stack_fffffffffffff690) [2];
  Op local_914;
  string local_908;
  spirv_cross local_8e8 [8];
  string bitcast_op;
  string local_8c0;
  uint local_8a0;
  uint local_89c;
  uint32_t r_1;
  uint32_t c_1;
  string local_878 [32];
  string local_858;
  undefined1 local_838 [8];
  SPIRType scalar_type_1;
  undefined1 local_6b4 [4];
  string local_6b0;
  uint local_68c;
  string local_688 [4];
  uint32_t c;
  string local_668 [32];
  string local_648 [32];
  string local_628;
  undefined1 local_608 [8];
  SPIRType vector_type;
  char *load_op_1;
  string local_498;
  uint local_474;
  string local_470 [4];
  uint32_t r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410 [32];
  string local_3f0;
  undefined1 local_3d0 [8];
  SPIRType scalar_type;
  char *local_250;
  char *load_op;
  string local_228;
  string local_208 [8];
  string template_expr;
  string load_expr;
  undefined1 local_1c0 [3];
  bool templated_load;
  string base;
  undefined1 local_190 [8];
  SPIRType target_type;
  SPIRType *type;
  SPIRAccessChain *chain_local;
  string *lhs_local;
  string *expr_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  target_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = Compiler::is_scalar((Compiler *)this,
                              (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
  if (bVar1) {
    local_914 = OpTypeInt;
  }
  else {
    local_914 = *(Op *)((long)&target_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4);
  }
  SPIRType::SPIRType((SPIRType *)local_190,local_914);
  target_type.super_IVariant.self.id = 8;
  target_type.basetype = *(BaseType *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt
  ;
  target_type.width =
       *(uint32_t *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
  bVar1 = VectorView<unsigned_int>::empty
                    ((VectorView<unsigned_int> *)
                     (target_type.member_name_cache._M_h._M_single_bucket + 4));
  if (bVar1) {
    if (*(int *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt == 0xf) {
      read_access_chain_struct(this,lhs,chain);
      base.field_2._8_4_ = 1;
    }
    else {
      if ((*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4) !=
           0x20) && (((this->hlsl_options).enable_16bit_types & 1U) == 0)) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar3,
                   "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                  );
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::__cxx11::string::string((string *)local_1c0,(string *)&chain->base);
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
      if (bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)local_1c0,uVar2);
      }
      bVar1 = 0x3d < (this->hlsl_options).shader_model;
      ::std::__cxx11::string::string((string *)(template_expr.field_2._M_local_buf + 8));
      ::std::__cxx11::string::string(local_208);
      if (bVar1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&load_op,this,target_type.member_name_cache._M_h._M_single_bucket,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_228,(spirv_cross *)0x569209,(char (*) [2])&load_op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
                   in_R8);
        ::std::__cxx11::string::operator=(local_208,(string *)&local_228);
        ::std::__cxx11::string::~string((string *)&local_228);
        ::std::__cxx11::string::~string((string *)&load_op);
      }
      if ((*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4) == 1)
         && ((chain->row_major_matrix & 1U) == 0)) {
        local_250 = (char *)0x0;
        switch(*(undefined4 *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
        case 1:
          local_250 = "Load";
          break;
        case 2:
          local_250 = "Load2";
          break;
        case 3:
          local_250 = "Load3";
          break;
        case 4:
          local_250 = "Load4";
          break;
        default:
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar3,"Unknown vector size.");
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar1) {
          local_250 = "Load";
        }
        in_R9 = (string *)0x5ac375;
        join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                  ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket,
                   (spirv_cross *)local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x565143,
                   (char (*) [2])&local_250,(char **)local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375,
                   (char (*) [2])&chain->dynamic_index,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &chain->static_index,(int *)0x5b7d4b,in_stack_fffffffffffff690);
        ::std::__cxx11::string::operator=
                  ((string *)(template_expr.field_2._M_local_buf + 8),
                   (string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
        ::std::__cxx11::string::~string
                  ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
      }
      else if (*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4) ==
               1) {
        if (bVar1) {
          SPIRType::SPIRType((SPIRType *)local_3d0,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type.basetype = Void;
          scalar_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_410,this,local_3d0,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_3f0,(spirv_cross *)0x569209,(char (*) [2])local_410,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
                     in_R8);
          ::std::__cxx11::string::operator=(local_208,(string *)&local_3f0);
          ::std::__cxx11::string::~string((string *)&local_3f0);
          ::std::__cxx11::string::~string(local_410);
          if (1 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_450,this,target_type.member_name_cache._M_h._M_single_bucket,0);
            ::std::operator+(&local_430,&local_450,"(");
            ::std::__cxx11::string::operator+=
                      ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&local_430);
            ::std::__cxx11::string::~string((string *)&local_430);
            ::std::__cxx11::string::~string((string *)&local_450);
          }
          SPIRType::~SPIRType((SPIRType *)local_3d0);
        }
        else if (1 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_470,this,local_190,0);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),local_470);
          ::std::__cxx11::string::~string(local_470);
          ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),"(")
          ;
        }
        for (local_474 = 0;
            local_474 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            local_474 = local_474 + 1) {
          in_R9 = &chain->dynamic_index;
          load_op_1._4_4_ = chain->static_index + local_474 * chain->matrix_stride;
          join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    (&local_498,(spirv_cross *)local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                     (char (*) [6])local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375,
                     (char (*) [2])in_R9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&load_op_1 + 4),(uint *)0x5b7d4b,in_stack_fffffffffffff688);
          ::std::__cxx11::string::operator+=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&local_498);
          ::std::__cxx11::string::~string((string *)&local_498);
          if (local_474 + 1 <
              *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
            ::std::__cxx11::string::operator+=
                      ((string *)(template_expr.field_2._M_local_buf + 8),", ");
          }
        }
        if (1 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
          ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),")")
          ;
        }
      }
      else if ((chain->row_major_matrix & 1U) == 0) {
        vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
        switch(*(undefined4 *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
        case 1:
          vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x597b06;
          break;
        case 2:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_47cdb9;
          break;
        case 3:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_47cdc5;
          break;
        case 4:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_47cdd1;
          break;
        default:
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar3,"Unknown vector size.");
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar1) {
          SPIRType::SPIRType((SPIRType *)local_608,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          vector_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_648,this,local_608,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_628,(spirv_cross *)0x569209,(char (*) [2])local_648,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
                     in_R8);
          ::std::__cxx11::string::operator=(local_208,(string *)&local_628);
          ::std::__cxx11::string::~string((string *)&local_628);
          ::std::__cxx11::string::~string(local_648);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_668,this,target_type.member_name_cache._M_h._M_single_bucket,0);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),local_668);
          ::std::__cxx11::string::~string(local_668);
          vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x597b06;
          SPIRType::~SPIRType((SPIRType *)local_608);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_688,this,local_190,0);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),local_688);
          ::std::__cxx11::string::~string(local_688);
        }
        ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),"(");
        for (local_68c = 0;
            local_68c <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
            local_68c = local_68c + 1) {
          local_6b4 = (undefined1  [4])(chain->static_index + local_68c * chain->matrix_stride);
          in_R9 = (string *)0x5ac375;
          join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    ((string *)(local_6b4 + 4),(spirv_cross *)local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x565143,
                     (char (*) [2])&vector_type.member_name_cache._M_h._M_single_bucket,
                     (char **)local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375,
                     (char (*) [2])&chain->dynamic_index,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b4,
                     (uint *)0x5b7d4b,in_stack_fffffffffffff690);
          ::std::__cxx11::string::operator+=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)(local_6b4 + 4));
          ::std::__cxx11::string::~string((string *)(local_6b4 + 4));
          if (local_68c + 1 <
              *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4)) {
            ::std::__cxx11::string::operator+=
                      ((string *)(template_expr.field_2._M_local_buf + 8),", ");
          }
        }
        ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),")");
      }
      else {
        if (bVar1) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type_1.member_name_cache._M_h._M_single_bucket,this,
                     target_type.member_name_cache._M_h._M_single_bucket,0);
          this_00 = &scalar_type_1.member_name_cache._M_h._M_single_bucket;
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)this_00);
          ::std::__cxx11::string::~string((string *)this_00);
          SPIRType::SPIRType((SPIRType *)local_838,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type_1.basetype = Void;
          scalar_type_1.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_878,this,local_838,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_858,(spirv_cross *)0x569209,(char (*) [2])local_878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
                     in_R8);
          ::std::__cxx11::string::operator=(local_208,(string *)&local_858);
          ::std::__cxx11::string::~string((string *)&local_858);
          ::std::__cxx11::string::~string(local_878);
          SPIRType::~SPIRType((SPIRType *)local_838);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&r_1,this,local_190,0);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&r_1);
          ::std::__cxx11::string::~string((string *)&r_1);
        }
        ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),"(");
        for (local_89c = 0;
            local_89c <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
            local_89c = local_89c + 1) {
          for (local_8a0 = 0;
              local_8a0 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
              local_8a0 = local_8a0 + 1) {
            in_R9 = &chain->dynamic_index;
            bitcast_op.field_2._12_4_ =
                 chain->static_index +
                 local_89c *
                 (*(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4
                           ) >> 3) + local_8a0 * chain->matrix_stride;
            join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                      (&local_8c0,(spirv_cross *)local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                       (char (*) [6])local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375
                       ,(char (*) [2])in_R9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&bitcast_op.field_2 + 0xc),(uint *)0x5b7d4b,in_stack_fffffffffffff688)
            ;
            ::std::__cxx11::string::operator+=
                      ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&local_8c0);
            ::std::__cxx11::string::~string((string *)&local_8c0);
            if ((local_8a0 + 1 <
                 *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) ||
               (local_89c + 1 <
                *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4))
               ) {
              ::std::__cxx11::string::operator+=
                        ((string *)(template_expr.field_2._M_local_buf + 8),", ");
            }
          }
        }
        ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),")");
      }
      if (!bVar1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                  (local_8e8,this,target_type.member_name_cache._M_h._M_single_bucket,local_190);
        uVar4 = ::std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (&local_908,local_8e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375,
                     (char (*) [2])((long)&template_expr.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                     (char (*) [2])in_R9);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&local_908);
          ::std::__cxx11::string::~string((string *)&local_908);
        }
        ::std::__cxx11::string::~string((string *)local_8e8);
      }
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        CompilerGLSL::
        statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,lhs,(char (*) [4])0x5abcd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&template_expr.field_2 + 8),(char (*) [2])0x5abb6c);
      }
      else {
        if (expr == (string *)0x0) {
          __assert_fail("expr",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_hlsl.cpp"
                        ,0x12a1,
                        "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                       );
        }
        ::std::__cxx11::string::operator=
                  ((string *)expr,(string *)(template_expr.field_2._M_local_buf + 8));
      }
      ::std::__cxx11::string::~string(local_208);
      ::std::__cxx11::string::~string((string *)(template_expr.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)local_1c0);
      base.field_2._8_4_ = 0;
    }
  }
  else {
    read_access_chain_array(this,lhs,chain);
    base.field_2._8_4_ = 1;
  }
  SPIRType::~SPIRType((SPIRType *)local_190);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type { is_scalar(type) ? OpTypeInt : type.op };
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	string base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = std::move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}